

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::AddKel(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
         *this,TPZFMatrix<std::complex<double>_> *elmat,TPZVec<long> *sourceindex,
        TPZVec<long> *destinationindex)

{
  TPZStackEqnStorage<std::complex<double>_> *this_00;
  TPZFrontSym<std::complex<double>_> *this_01;
  DecomposeType DVar1;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<std::complex<double>_> AuxEqn;
  long local_5208;
  int64_t local_5200;
  TPZEqnArray<std::complex<double>_> local_51f8;
  
  this_01 = &this->fFront;
  TPZFrontSym<std::complex<double>_>::AddKel(this_01,elmat,sourceindex,destinationindex);
  EquationsToDecompose(this,destinationindex,&local_5200,&local_5208);
  TPZEqnArray<std::complex<double>_>::TPZEqnArray(&local_51f8);
  if (local_5200 <= local_5208) {
    TPZFrontSym<std::complex<double>_>::DecomposeEquations
              (this_01,local_5200,local_5208,&local_51f8);
    CheckCompress(this);
    this_00 = &this->fStorage;
    TPZStackEqnStorage<std::complex<double>_>::AddEqnArray(this_00,&local_51f8);
    if (local_5208 ==
        (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).
        super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow + -1) {
      TPZFrontSym<std::complex<double>_>::Reset(this_01,0);
      TPZStackEqnStorage<std::complex<double>_>::FinishWriting(this_00);
      TPZStackEqnStorage<std::complex<double>_>::ReOpen(this_00);
    }
  }
  DVar1 = TPZFrontSym<std::complex<double>_>::GetDecomposeType(this_01);
  (this->super_TPZAbstractFrontMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>
  .super_TPZBaseMatrix.fDecomposed = (char)DVar1;
  TPZEqnArray<std::complex<double>_>::~TPZEqnArray(&local_51f8);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & sourceindex, TPZVec < int64_t > & destinationindex)
{
	fFront.AddKel(elmat, sourceindex, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	
	int64_t mineq, maxeq;
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fFront.Reset(0);
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}